

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wopn_file.c
# Opt level: O0

int WOPN_BanksCmp(WOPNFile *bank1,WOPNFile *bank2)

{
  int iVar1;
  int local_20;
  uint local_1c;
  int i;
  int res;
  WOPNFile *bank2_local;
  WOPNFile *bank1_local;
  
  local_1c = (uint)(bank1->banks_count_percussion == bank2->banks_count_percussion &&
                   (bank1->banks_count_melodic == bank2->banks_count_melodic &&
                   (bank1->volume_model == bank2->volume_model &&
                   (bank1->chip_type == bank2->chip_type &&
                   (bank1->lfo_freq == bank2->lfo_freq && bank1->version == bank2->version)))));
  if (local_1c != 0) {
    for (local_20 = 0; local_20 < (int)(uint)bank1->banks_count_melodic; local_20 = local_20 + 1) {
      iVar1 = memcmp(bank1->banks_melodic + local_20,bank2->banks_melodic + local_20,0x2424);
      local_1c = iVar1 == 0 & local_1c;
    }
    if (local_1c != 0) {
      for (local_20 = 0; local_20 < (int)(uint)bank1->banks_count_percussion;
          local_20 = local_20 + 1) {
        iVar1 = memcmp(bank1->banks_percussive + local_20,bank2->banks_percussive + local_20,0x2424)
        ;
        local_1c = iVar1 == 0 & local_1c;
      }
    }
  }
  return local_1c;
}

Assistant:

int WOPN_BanksCmp(const WOPNFile *bank1, const WOPNFile *bank2)
{
    int res = 1;

    res &= (bank1->version == bank2->version);
    res &= (bank1->lfo_freq == bank2->lfo_freq);
    res &= (bank1->chip_type == bank2->chip_type);
    res &= (bank1->volume_model == bank2->volume_model);
    res &= (bank1->banks_count_melodic == bank2->banks_count_melodic);
    res &= (bank1->banks_count_percussion == bank2->banks_count_percussion);

    if(res)
    {
        int i;
        for(i = 0; i < bank1->banks_count_melodic; i++)
            res &= (memcmp(&bank1->banks_melodic[i], &bank2->banks_melodic[i], sizeof(WOPNBank)) == 0);
        if(res)
        {
            for(i = 0; i < bank1->banks_count_percussion; i++)
                res &= (memcmp(&bank1->banks_percussive[i], &bank2->banks_percussive[i], sizeof(WOPNBank)) == 0);
        }
    }

    return res;
}